

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O2

int secp256k1_nonce_function_smallint
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint attempt)

{
  uint uVar1;
  
  uVar1 = *data;
  if (attempt != 0) {
    uVar1 = (int)(uVar1 + 1) % 0xd;
    *(uint *)data = uVar1;
  }
  nonce32[0xc] = '\0';
  nonce32[0xd] = '\0';
  nonce32[0xe] = '\0';
  nonce32[0xf] = '\0';
  nonce32[0x10] = '\0';
  nonce32[0x11] = '\0';
  nonce32[0x12] = '\0';
  nonce32[0x13] = '\0';
  nonce32[0x14] = '\0';
  nonce32[0x15] = '\0';
  nonce32[0x16] = '\0';
  nonce32[0x17] = '\0';
  nonce32[0x18] = '\0';
  nonce32[0x19] = '\0';
  nonce32[0x1a] = '\0';
  nonce32[0x1b] = '\0';
  nonce32[0] = '\0';
  nonce32[1] = '\0';
  nonce32[2] = '\0';
  nonce32[3] = '\0';
  nonce32[4] = '\0';
  nonce32[5] = '\0';
  nonce32[6] = '\0';
  nonce32[7] = '\0';
  nonce32[8] = '\0';
  nonce32[9] = '\0';
  nonce32[10] = '\0';
  nonce32[0xb] = '\0';
  nonce32[0xc] = '\0';
  nonce32[0xd] = '\0';
  nonce32[0xe] = '\0';
  nonce32[0xf] = '\0';
  *(uint *)(nonce32 + 0x1c) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return 1;
}

Assistant:

static int secp256k1_nonce_function_smallint(unsigned char *nonce32, const unsigned char *msg32,
                                      const unsigned char *key32, const unsigned char *algo16,
                                      void *data, unsigned int attempt) {
    secp256k1_scalar s;
    int *idata = data;
    (void)msg32;
    (void)key32;
    (void)algo16;
    /* Some nonces cannot be used because they'd cause s and/or r to be zero.
     * The signing function has retry logic here that just re-calls the nonce
     * function with an increased `attempt`. So if attempt > 0 this means we
     * need to change the nonce to avoid an infinite loop. */
    if (attempt > 0) {
        *idata = (*idata + 1) % EXHAUSTIVE_TEST_ORDER;
    }
    secp256k1_scalar_set_int(&s, *idata);
    secp256k1_scalar_get_b32(nonce32, &s);
    return 1;
}